

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O0

bool __thiscall
Inferences::FunctionDefinitionDemodulation::perform
          (FunctionDefinitionDemodulation *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  TypedTermList t;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Result r;
  TermList eqLHS;
  Literal **ppLVar5;
  TermList in_RCX;
  anon_union_8_2_f154dc0f_for_Term_10 *in_RDX;
  Clause *in_RSI;
  ResultSubstitutionSP *in_RDI;
  SingletonIterator<Kernel::Clause_*> SVar6;
  bool *unaff_retaddr;
  Inference *in_stack_00000008;
  Clause *res;
  bool isEqTautology;
  TermList rhs;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> qr;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
  git;
  bool redundancyCheck;
  TypedTermList trm;
  NonVariableNonTypeIterator it;
  Literal *lit;
  uint li;
  uint cLen;
  Ordering *ordering;
  TermList in_stack_fffffffffffffdb8;
  Clause *in_stack_fffffffffffffdc0;
  Clause *in_stack_fffffffffffffdc8;
  Inference *in_stack_fffffffffffffdd0;
  TermList in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  anon_union_8_2_f154dc0f_for_Term_10 in_stack_fffffffffffffde8;
  Clause *pCVar7;
  Clause *pCVar8;
  Clause *in_stack_fffffffffffffe00;
  SimplifyingInference2 local_180;
  Inference local_168;
  undefined1 local_138 [48];
  undefined8 local_108;
  uint64_t local_100;
  undefined8 local_f8;
  uint64_t local_f0;
  int local_e4;
  SmartPtr<Indexing::ResultSubstitution> local_e0;
  undefined8 *local_d0;
  int local_c8;
  undefined4 uStack_c4;
  undefined8 uStack_c0;
  int local_a8;
  undefined4 uStack_a4;
  byte local_99;
  int local_98;
  undefined4 uStack_94;
  undefined8 uStack_90;
  Literal *eqLit;
  undefined4 in_stack_ffffffffffffffb8;
  uint n;
  undefined4 in_stack_ffffffffffffffc4;
  Clause *in_stack_ffffffffffffffc8;
  ResultSubstitutionSP *subst;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  subst = in_RDI;
  eqLHS._content =
       (uint64_t)Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x7bc0b0);
  if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::attempted
       == '\0') &&
     (iVar2 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                   ::attempted), iVar2 != 0)) {
    Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::DHSet
              ((DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x7bc0de);
    __cxa_atexit(Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet,
                 &perform::attempted,&__dso_handle);
    __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                         ::attempted);
  }
  Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            ((DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x7bc112);
  uVar3 = Kernel::Clause::length(in_RSI);
  for (n = 0; n < uVar3; n = n + 1) {
    ppLVar5 = Kernel::Clause::operator[](in_RSI,n);
    eqLit = *ppLVar5;
    Kernel::NonVariableNonTypeIterator::NonVariableNonTypeIterator
              ((NonVariableNonTypeIterator *)
               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               (Term *)in_stack_fffffffffffffdd8._content,
               SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0));
    do {
      while( true ) {
        bVar1 = Kernel::NonVariableNonTypeIterator::hasNext((NonVariableNonTypeIterator *)0x7bc188);
        if (!bVar1) {
          local_e4 = 0;
          goto LAB_007bc75b;
        }
        Kernel::NonVariableNonTypeIterator::next
                  ((NonVariableNonTypeIterator *)in_stack_fffffffffffffe00);
        Kernel::TypedTermList::TypedTermList
                  ((TypedTermList *)in_stack_fffffffffffffdd0,(Term *)in_stack_fffffffffffffdc8);
        Kernel::TermList::term((TermList *)0x7bc1dc);
        bVar1 = Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                          ((DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                           in_stack_fffffffffffffdc0,(Term *)in_stack_fffffffffffffdb8._content);
        if (bVar1) break;
        Kernel::NonVariableNonTypeIterator::right
                  ((NonVariableNonTypeIterator *)in_stack_fffffffffffffdc0);
      }
      local_a8 = local_98;
      uStack_a4 = uStack_94;
      local_99 = DemodulationHelper::redundancyCheckNeededForPremise
                           ((DemodulationHelper *)in_stack_fffffffffffffdd0,
                            in_stack_fffffffffffffdc8,(Literal *)in_stack_fffffffffffffdc0,
                            in_stack_fffffffffffffdd8);
      Saturation::SaturationAlgorithm::getFunctionDefinitionHandler
                ((SaturationAlgorithm *)in_RDI->_refCnt);
      local_c8 = local_98;
      uStack_c4 = uStack_94;
      uStack_c0 = uStack_90;
      t.super_TermList._content._7_1_ = in_stack_fffffffffffffde7;
      t.super_TermList._content._0_7_ = in_stack_fffffffffffffde0;
      t._sort._content = (uint64_t)in_stack_fffffffffffffde8;
      Shell::FunctionDefinitionHandler::getGeneralizations
                ((FunctionDefinitionHandler *)in_stack_fffffffffffffdd8._content,t);
      do {
        bVar1 = Lib::
                VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                           *)0x7bc316);
        if (!bVar1) {
          local_e4 = 0;
          break;
        }
        Lib::
        VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
        ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                *)in_stack_fffffffffffffdb8._content);
        uVar4 = Kernel::Clause::length((Clause *)local_d0[3]);
        if (uVar4 == 1) {
          local_f8 = *local_d0;
          local_100 = (uint64_t)
                      Kernel::EqHelper::getOtherEqualitySide
                                ((Literal *)0x7bc3c6,in_stack_fffffffffffffdb8);
          local_108 = *local_d0;
          local_f0 = local_100;
          r = (*((Ordering *)eqLHS._content)->_vptr_Ordering[3])(eqLHS._content,local_100,local_108)
          ;
          bVar1 = Kernel::Ordering::isGreaterOrEqual(r);
          if (bVar1) {
            local_e4 = 7;
          }
          else {
            local_138[0x2f] = 0;
            local_138._24_8_ = _local_98;
            local_138._16_8_ = *local_d0;
            in_stack_fffffffffffffe00 = in_RSI;
            Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr
                      ((SmartPtr<Indexing::ResultSubstitution> *)local_138,&local_e0);
            if ((local_99 & 1) == 0) {
              pCVar7 = (Clause *)0x0;
            }
            else {
              pCVar7 = (Clause *)(in_RDI + 1);
            }
            pCVar8 = pCVar7;
            Kernel::SimplifyingInference2::SimplifyingInference2
                      (&local_180,FUNCTION_DEFINITION_DEMODULATION,in_RSI,(Clause *)local_d0[3]);
            Kernel::Inference::Inference
                      ((Inference *)in_stack_fffffffffffffdc0,
                       (SimplifyingInference2 *)in_stack_fffffffffffffdb8._content);
            in_stack_fffffffffffffdc0 = pCVar7;
            in_stack_fffffffffffffdd0 = &local_168;
            in_stack_fffffffffffffdc8 = (Clause *)(local_138 + 0x2f);
            in_stack_fffffffffffffdb8._content = (uint64_t)local_138;
            pCVar7 = in_stack_fffffffffffffdc0;
            in_stack_fffffffffffffde8 =
                 (anon_union_8_2_f154dc0f_for_Term_10)
                 performRewriting(in_stack_ffffffffffffffc8,
                                  (Literal *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),in_RCX,
                                  (Clause *)CONCAT44(n,in_stack_ffffffffffffffb8),eqLit,eqLHS,subst,
                                  (DemodulationHelper *)
                                  CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                  unaff_retaddr,in_stack_00000008);
            Kernel::Inference::~Inference(&local_168);
            Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
                      ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_fffffffffffffdc0);
            local_138._32_8_ = in_stack_fffffffffffffde8;
            if ((in_stack_fffffffffffffde8 == (anon_union_8_2_f154dc0f_for_Term_10)0x0) &&
               ((local_138[0x2f] & 1) == 0)) {
              local_e4 = 7;
            }
            else {
              if ((local_138[0x2f] & 1) == 0) {
                *in_RDX = in_stack_fffffffffffffde8;
              }
              SVar6 = Lib::getSingletonIterator<Kernel::Clause*>((Clause *)0x7bc64c);
              in_stack_fffffffffffffdd8._content = (uint64_t)SVar6._el;
              in_stack_fffffffffffffde7 = SVar6._finished;
              SVar6._el = pCVar8;
              SVar6._0_8_ = pCVar7;
              Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(SVar6);
              Lib::VirtualIterator<Kernel::Clause_*>::operator=
                        ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffdd0,
                         (VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffdc8);
              Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                        ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffdc0);
              in_stack_ffffffffffffffff = 1;
              local_e4 = 1;
            }
          }
        }
        else {
          local_e4 = 7;
        }
        Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>
        ::~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>
                     *)0x7bc6f6);
      } while (local_e4 == 7);
      Lib::
      VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
      ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                          *)in_stack_fffffffffffffdc0);
    } while (local_e4 == 0);
LAB_007bc75b:
    Kernel::NonVariableNonTypeIterator::~NonVariableNonTypeIterator
              ((NonVariableNonTypeIterator *)in_stack_fffffffffffffdc0);
    if (local_e4 != 0) goto LAB_007bc7a6;
  }
  in_stack_ffffffffffffffff = 0;
LAB_007bc7a6:
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

bool FunctionDefinitionDemodulation::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  Ordering& ordering = _salg->getOrdering();

  static DHSet<Term*> attempted;
  attempted.reset();

  unsigned cLen = cl->length();
  for (unsigned li = 0; li < cLen; li++) {
    Literal* lit = (*cl)[li];
    NonVariableNonTypeIterator it(lit);
    while (it.hasNext()) {
      TypedTermList trm = it.next();
      if (!attempted.insert(trm.term())) {
        it.right();
        continue;
      }

      bool redundancyCheck = _helper.redundancyCheckNeededForPremise(cl, lit, trm);

      auto git = _salg->getFunctionDefinitionHandler().getGeneralizations(trm);
      while (git.hasNext()) {
        auto qr = git.next();
        if (qr.data->clause->length() != 1) {
          continue;
        }
        auto rhs = EqHelper::getOtherEqualitySide(qr.data->literal, qr.data->term);
        // TODO shouldn't allow demodulation with incomparables in the non-ground case
        if (Ordering::isGreaterOrEqual(ordering.compare(rhs,qr.data->term))) {
          continue;
        }
        bool isEqTautology = false;
        auto res = performRewriting(
          cl, lit, trm, qr.data->clause, qr.data->literal, qr.data->term, qr.unifier, redundancyCheck ? &_helper : nullptr,
          isEqTautology, Inference(SimplifyingInference2(InferenceRule::FUNCTION_DEFINITION_DEMODULATION, cl, qr.data->clause)));
        if (!res && !isEqTautology) {
          continue;
        }
        if (!isEqTautology) {
          replacement = res;
        }
        premises = pvi(getSingletonIterator(qr.data->clause));
        return true;
      }
    }
  }

  return false;
}